

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t Catch::listTestsNamesOnly(Config *config)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  ostream *poVar2;
  size_t sVar3;
  undefined1 auVar4 [8];
  undefined1 local_f0 [8];
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  pointer local_b8;
  pointer pPStack_b0;
  pointer local_a8;
  pointer pFStack_a0;
  pointer local_98;
  pointer pFStack_90;
  TagAliasRegistry *local_88;
  TestSpec local_80;
  string local_68;
  undefined1 local_48 [8];
  TestSpec testSpec;
  
  iVar1 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)local_48,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar1));
  iVar1 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar1) == ((long *)CONCAT44(extraout_var_00,iVar1))[1]) {
    TagAliasRegistry::get();
    matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&local_c8;
    local_c8._M_local_buf[0] = '\0';
    local_b8 = (pointer)0x0;
    pPStack_b0 = (pointer)0x0;
    local_a8 = (pointer)0x0;
    pFStack_a0 = (pointer)0x0;
    local_98 = (pointer)0x0;
    pFStack_90 = (pointer)0x0;
    local_88 = &TagAliasRegistry::get::instance;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"*",
               (allocator<char> *)
               ((long)&testSpec.m_filters.
                       super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    this = TestSpecParser::parse((TestSpecParser *)local_f0,&local_68);
    TestSpecParser::testSpec(&local_80,this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::_M_move_assign
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)local_48
               ,&local_80);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_80.m_filters);
    std::__cxx11::string::~string((string *)&local_68);
    TestSpecParser::~TestSpecParser((TestSpecParser *)local_f0);
  }
  testCases = getAllTestCasesSorted((IConfig *)config);
  filterTests((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)local_f0,testCases,
              (TestSpec *)local_48,(IConfig *)config);
  sVar3 = 0;
  for (auVar4 = local_f0;
      auVar4 != (undefined1  [8])
                matchedTestCases.
                super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                super__Vector_impl_data._M_start; auVar4 = (undefined1  [8])((long)auVar4 + 0x118))
  {
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)auVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
    sVar3 = sVar3 + 1;
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)local_f0);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)local_48);
  return sVar3;
}

Assistant:

inline std::size_t listTestsNamesOnly( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( !config.testSpec().hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        std::size_t matchedTests = 0;
        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            matchedTests++;
            TestCaseInfo const& testCaseInfo = it->getTestCaseInfo();
            Catch::cout() << testCaseInfo.name << std::endl;
        }
        return matchedTests;
    }